

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_boolean_t
flat_file_predicate_key_match(ion_flat_file_t *flat_file,ion_flat_file_row_t *row,va_list *args)

{
  uint uVar1;
  char cVar2;
  bool local_41;
  undefined8 *local_40;
  ion_key_t target_key;
  va_list *args_local;
  ion_flat_file_row_t *row_local;
  ion_flat_file_t *flat_file_local;
  
  uVar1 = (*args)[0].gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar1 + (long)(*args)[0].reg_save_area);
    (*args)[0].gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = local_40 + 1;
  }
  local_41 = false;
  if (row->row_status == '\x01') {
    cVar2 = (*(flat_file->super).compare)
                      ((ion_key_t)*local_40,row->key,(flat_file->super).record.key_size);
    local_41 = cVar2 == '\0';
  }
  return local_41;
}

Assistant:

ion_boolean_t
flat_file_predicate_key_match(
	ion_flat_file_t		*flat_file,
	ion_flat_file_row_t *row,
	va_list				*args
) {
	ion_key_t target_key = va_arg(*args, ion_key_t);

	return ION_FLAT_FILE_STATUS_OCCUPIED == row->row_status && 0 == flat_file->super.compare(target_key, row->key, flat_file->super.record.key_size);
}